

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_model.c
# Opt level: O2

HTS_Boolean HTS_ModelSet_get_gv_flag(HTS_ModelSet *ms,char *string)

{
  byte bVar1;
  
  if (ms->gv_off_context != (HTS_Question *)0x0) {
    bVar1 = HTS_Question_match(ms->gv_off_context,string);
    return bVar1 ^ 1;
  }
  return '\x01';
}

Assistant:

HTS_Boolean HTS_ModelSet_get_gv_flag(HTS_ModelSet * ms, const char *string)
{
   if (ms->gv_off_context == NULL)
      return TRUE;
   else if (HTS_Question_match(ms->gv_off_context, string) == TRUE)
      return FALSE;
   else
      return TRUE;
}